

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MemoryBuffer.cpp
# Opt level: O0

bool shouldUseMmap(int FD,size_t FileSize,size_t MapSize,off_t Offset,bool RequiresNullTerminator,
                  int PageSize,bool IsVolatile)

{
  bool bVar1;
  error_code eVar2;
  size_t End;
  error_category *local_88;
  undefined1 local_80 [8];
  file_status Status;
  bool IsVolatile_local;
  int PageSize_local;
  bool RequiresNullTerminator_local;
  off_t Offset_local;
  size_t MapSize_local;
  size_t FileSize_local;
  int FD_local;
  
  Status.fs_st_ino._7_1_ = IsVolatile;
  if (IsVolatile) {
    FileSize_local._7_1_ = false;
  }
  else if ((MapSize < 0x4000) || (MapSize < (uint)PageSize)) {
    FileSize_local._7_1_ = false;
  }
  else if (RequiresNullTerminator) {
    MapSize_local = FileSize;
    if (FileSize == 0xffffffffffffffff) {
      llvm::sys::fs::file_status::file_status((file_status *)local_80);
      eVar2 = llvm::sys::fs::status(FD,(file_status *)local_80);
      local_88 = eVar2._M_cat;
      End._0_4_ = eVar2._M_value;
      bVar1 = std::error_code::operator_cast_to_bool((error_code *)&End);
      if (bVar1) {
        return false;
      }
      MapSize_local = llvm::sys::fs::basic_file_status::getSize((basic_file_status *)local_80);
    }
    if (MapSize_local < Offset + MapSize) {
      __assert_fail("End <= FileSize",
                    "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/lib/llvm/Support/MemoryBuffer.cpp"
                    ,0x157,"bool shouldUseMmap(int, size_t, size_t, off_t, bool, int, bool)");
    }
    if (Offset + MapSize == MapSize_local) {
      if ((MapSize_local & (long)(PageSize + -1)) == 0) {
        FileSize_local._7_1_ = false;
      }
      else {
        FileSize_local._7_1_ = true;
      }
    }
    else {
      FileSize_local._7_1_ = false;
    }
  }
  else {
    FileSize_local._7_1_ = true;
  }
  return FileSize_local._7_1_;
}

Assistant:

static bool shouldUseMmap(int FD,
                          size_t FileSize,
                          size_t MapSize,
                          off_t Offset,
                          bool RequiresNullTerminator,
                          int PageSize,
                          bool IsVolatile) {
  // mmap may leave the buffer without null terminator if the file size changed
  // by the time the last page is mapped in, so avoid it if the file size is
  // likely to change.
  if (IsVolatile)
    return false;

  // We don't use mmap for small files because this can severely fragment our
  // address space.
  if (MapSize < 4 * 4096 || MapSize < (unsigned)PageSize)
    return false;

  if (!RequiresNullTerminator)
    return true;

  // If we don't know the file size, use fstat to find out.  fstat on an open
  // file descriptor is cheaper than stat on a random path.
  // FIXME: this chunk of code is duplicated, but it avoids a fstat when
  // RequiresNullTerminator = false and MapSize != -1.
  if (FileSize == size_t(-1)) {
    sys::fs::file_status Status;
    if (sys::fs::status(FD, Status))
      return false;
    FileSize = Status.getSize();
  }

  // If we need a null terminator and the end of the map is inside the file,
  // we cannot use mmap.
  size_t End = Offset + MapSize;
  assert(End <= FileSize);
  if (End != FileSize)
    return false;

  // Don't try to map files that are exactly a multiple of the system page size
  // if we need a null terminator.
  if ((FileSize & (PageSize -1)) == 0)
    return false;

#if defined(__CYGWIN__)
  // Don't try to map files that are exactly a multiple of the physical page size
  // if we need a null terminator.
  // FIXME: We should reorganize again getPageSize() on Win32.
  if ((FileSize & (4096 - 1)) == 0)
    return false;
#endif

  return true;
}